

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::DrawReadBuffersErrorsTest::PrepareObjects
          (DrawReadBuffersErrorsTest *this)

{
  code *pcVar1;
  char cVar2;
  int iVar3;
  deUint32 dVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  GLenum *pGVar6;
  GLint i;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  GLint max_draw_buffers;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar8 + 0x6d0))(1,&this->m_fbo_valid);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1613);
  (**(code **)(lVar8 + 0x78))(0x8d40,this->m_fbo_valid);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1616);
  do {
    pcVar1 = *(code **)(lVar8 + 0xc88);
    this->m_fbo_invalid = this->m_fbo_invalid + 1;
    cVar2 = (*pcVar1)();
  } while (cVar2 != '\0');
  (**(code **)(lVar8 + 0x868))(0x8cdf,&this->m_max_color_attachments);
  GVar5 = this->m_attachment_invalid;
  uVar7 = 0;
  if (0 < this->m_max_color_attachments) {
    uVar7 = this->m_max_color_attachments;
  }
  for (; ((GVar5 - 0x3ff < 9 || (GVar5 == 0xffffffff)) || (GVar5 - 0x8cdf < uVar7));
      GVar5 = GVar5 + 1) {
  }
  this->m_attachment_invalid = GVar5 + 1;
  this->m_attachments_invalid[0] = 0x8ce0;
  this->m_attachments_invalid[1] = 0x8ce0;
  max_draw_buffers = 8;
  (**(code **)(lVar8 + 0x868))(0x8824,&max_draw_buffers);
  iVar3 = max_draw_buffers + 1;
  this->m_attachments_too_many_count = iVar3;
  uVar9 = 0xffffffffffffffff;
  if (-1 < iVar3) {
    uVar9 = (long)iVar3 * 4;
  }
  pGVar6 = (GLenum *)operator_new__(uVar9);
  this->m_attachments_too_many = pGVar6;
  *pGVar6 = 0x8ce0;
  for (lVar8 = 1; lVar8 < iVar3; lVar8 = lVar8 + 1) {
    pGVar6[lVar8] = 0;
  }
  return;
}

Assistant:

void DrawReadBuffersErrorsTest::PrepareObjects()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Valid objects. */
	gl.genFramebuffers(1, &m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	/* Invalid objects. */
	while (gl.isFramebuffer(++m_fbo_invalid))
		;

	/* Invalid attachment. */
	gl.getIntegerv(GL_MAX_COLOR_ATTACHMENTS, &m_max_color_attachments);

	bool is_attachment = true;

	while (is_attachment)
	{
		++m_attachment_invalid;

		is_attachment = false;

		/* Valid attachments are those from tables 17.4, 17.5 and a 17.6 (valid for various functions and framebuffer types).
		 (see OpenGL 4.5 Core Profile Specification) */
		switch (m_attachment_invalid)
		{
		case GL_NONE:
		case GL_FRONT_LEFT:
		case GL_FRONT_RIGHT:
		case GL_BACK_LEFT:
		case GL_BACK_RIGHT:
		case GL_FRONT:
		case GL_BACK:
		case GL_LEFT:
		case GL_RIGHT:
		case GL_FRONT_AND_BACK:
			is_attachment = true;
		};

		for (glw::GLint i = 0; i < m_max_color_attachments; ++i)
		{
			if ((glw::GLenum)(GL_COLOR_ATTACHMENT0 + i) == m_attachment_invalid)
			{
				is_attachment = true;
				break;
			}
		}
	}

	m_attachments_invalid[0] = GL_COLOR_ATTACHMENT0;
	m_attachments_invalid[1] = GL_COLOR_ATTACHMENT0;

	glw::GLint max_draw_buffers = 8; /* Spec default. */
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &max_draw_buffers);

	m_attachments_too_many_count = max_draw_buffers + 1;

	m_attachments_too_many = new glw::GLenum[m_attachments_too_many_count];

	m_attachments_too_many[0] = GL_COLOR_ATTACHMENT0;

	for (glw::GLint i = 1; i < m_attachments_too_many_count; ++i)
	{
		m_attachments_too_many[i] = GL_NONE;
	}
}